

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * __thiscall QByteArray::fill(QByteArray *this,char ch,qsizetype size)

{
  qsizetype qVar1;
  char *__s;
  size_t __n;
  qsizetype in_RDX;
  byte in_SIL;
  QArrayDataPointer<char> *in_RDI;
  
  if (in_RDX < 0) {
    in_RDX = QByteArray::size((QByteArray *)in_RDI);
  }
  resize((QByteArray *)in_RDI,in_RDX);
  qVar1 = QByteArray::size((QByteArray *)in_RDI);
  if (qVar1 != 0) {
    __s = QArrayDataPointer<char>::data(in_RDI);
    __n = QByteArray::size((QByteArray *)in_RDI);
    memset(__s,(uint)in_SIL,__n);
  }
  return (QByteArray *)in_RDI;
}

Assistant:

QByteArray &QByteArray::fill(char ch, qsizetype size)
{
    resize(size < 0 ? this->size() : size);
    if (this->size())
        memset(d.data(), ch, this->size());
    return *this;
}